

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void jsondec_wellknown(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  char *pcVar1;
  char cVar2;
  jsondec *pjVar3;
  upb_MessageValue val;
  bool bVar4;
  _Bool _Var5;
  upb_WellKnown uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  upb_EncodeStatus uVar12;
  int iVar13;
  upb_FieldDef *puVar14;
  char *pcVar15;
  upb_MessageDef *puVar16;
  upb_MutableMessageValue arr;
  char *pcVar17;
  upb_MiniTable *puVar18;
  upb_Message *puVar19;
  ulong __n;
  char *pcVar21;
  ulong size;
  char *pcVar22;
  upb_Arena *puVar23;
  char *pcVar24;
  upb_Map *end;
  long lVar25;
  jsondec *pjVar26;
  upb_StringView uVar27;
  upb_MessageValue uVar28;
  upb_MessageValue val_00;
  upb_MessageValue seconds;
  char *ptr;
  _Bool local_89;
  jsondec *local_88;
  char *pcStack_80;
  upb_Message *local_78;
  upb_MessageValue local_70;
  char local_60;
  upb_FieldDef *local_58;
  upb_MessageDef *local_50;
  jsondec *local_48;
  upb_FieldDef *local_40;
  char *local_38;
  undefined8 uVar20;
  
  if (((ulong)msg->field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5d6,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  uVar6 = upb_MessageDef_WellKnownType(m);
  switch(uVar6) {
  case kUpb_WellKnown_Any:
    if (((ulong)msg->field_0 & 1) != 0) {
      local_78 = msg;
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x588,"void jsondec_any(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    local_78 = msg;
    local_50 = m;
    local_58 = upb_MessageDef_FindFieldByNumber(m,2);
    jsondec_objstart(d);
    pjVar26 = (jsondec *)0x0;
    pcVar22 = (char *)0x0;
    do {
      _Var5 = jsondec_objnext(d);
      if (!_Var5) {
        pcVar22 = "Any object didn\'t contain a \'@type\' field";
        goto LAB_002eeab8;
      }
      pjVar3 = (jsondec *)d->ptr;
      uVar27 = jsondec_string(d);
      jsondec_skipws(d);
      jsondec_parselit(d,":");
      _Var5 = jsondec_streql(uVar27,"@type");
      puVar19 = local_78;
      if (_Var5) {
        local_88 = pjVar26;
        local_48 = pjVar3;
        if (((ulong)local_78->field_0 & 1) != 0) {
          __assert_fail("!upb_Message_IsFrozen(msg)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                        ,0x56a,
                        "const upb_MessageDef *jsondec_typeurl(jsondec *, upb_Message *, const upb_MessageDef *)"
                       );
        }
        local_40 = upb_MessageDef_FindFieldByNumber(local_50,1);
        uVar28.str_val = jsondec_string(d);
        pcVar15 = uVar28.str_val.data;
        pcVar24 = pcVar15 + uVar28.str_val.size;
        upb_Message_SetFieldByDef(puVar19,local_40,uVar28,d->arena);
        pjVar26 = local_88;
        pcVar17 = pcVar24;
        do {
          pcVar21 = pcVar17;
          if (pcVar17 <= pcVar15) break;
          pcVar21 = pcVar17 + -1;
          pcVar1 = pcVar17 + -1;
          pcVar17 = pcVar21;
        } while (*pcVar1 != '/');
        if ((pcVar21 == pcVar15) || (pcVar21 == pcVar24)) {
          jsondec_err(d,"Type url must have at least one \'/\' and non-empty host");
        }
        puVar16 = upb_DefPool_FindMessageByNameWithSize
                            (d->symtab,pcVar21 + 1,(long)pcVar24 - (long)(pcVar21 + 1));
        if (puVar16 == (upb_MessageDef *)0x0) {
          pcVar22 = "Type was not found";
          goto LAB_002eeab8;
        }
        if (pjVar26 == (jsondec *)0x0) {
          pjVar26 = (jsondec *)0x0;
          break;
        }
        pcVar22 = (char *)((long)&local_48->ptr + 1);
        do {
          pcVar24 = pcVar22 + -1;
          pcVar22 = pcVar22 + -1;
        } while (*pcVar24 != ',');
      }
      else {
        if (pjVar26 == (jsondec *)0x0) {
          pjVar26 = pjVar3;
        }
        jsondec_skipval(d);
        puVar16 = (upb_MessageDef *)0x0;
      }
    } while (puVar16 == (upb_MessageDef *)0x0);
    puVar18 = upb_MessageDef_MiniTable(puVar16);
    puVar19 = upb_Message_New(puVar18,d->arena);
    if (pjVar26 != (jsondec *)0x0) {
      __n = (long)pcVar22 - (long)pjVar26;
      puVar23 = d->arena;
      size = (__n & 0xfffffffffffffff8) + 8;
      pcVar22 = puVar23->ptr_dont_copy_me__upb_internal_use_only;
      if ((ulong)((long)puVar23->end_dont_copy_me__upb_internal_use_only - (long)pcVar22) < size) {
        pcVar22 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar23,size);
      }
      else {
        if ((char *)((ulong)(pcVar22 + 7) & 0xfffffffffffffff8) != pcVar22) {
          __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
        }
        puVar23->ptr_dont_copy_me__upb_internal_use_only = pcVar22 + size;
      }
      local_88 = (jsondec *)d->ptr;
      pcStack_80 = d->end;
      memcpy(pcVar22,pjVar26,__n);
      pcVar22[__n] = '}';
      d->ptr = pcVar22;
      d->end = pcVar22 + __n + 1;
      d->is_first = true;
      while (_Var5 = jsondec_objnext(d), _Var5) {
        jsondec_anyfield(d,puVar19,puVar16);
      }
      d->ptr = (char *)local_88;
      d->end = pcStack_80;
    }
    while (_Var5 = jsondec_objnext(d), _Var5) {
      jsondec_anyfield(d,puVar19,puVar16);
    }
    d->depth = d->depth + 1;
    jsondec_wsch(d,'}');
    puVar18 = upb_MessageDef_MiniTable(puVar16);
    uVar12 = upb_Encode(puVar19,puVar18,0,d->arena,(char **)&local_70.array_val,
                        &local_70.str_val.size);
    if (uVar12 != kUpb_EncodeStatus_Ok) {
      __assert_fail("status == kUpb_EncodeStatus_Ok",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5c7,"void jsondec_any(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    puVar23 = d->arena;
    uVar20 = local_70.double_val;
    puVar14 = local_58;
    msg = local_78;
    break;
  case kUpb_WellKnown_FieldMask:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x53f,
                    "void jsondec_fieldmask(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    puVar14 = upb_MessageDef_FindFieldByNumber(m,1);
    arr = upb_Message_Mutable(msg,puVar14,d->arena);
    uVar27 = jsondec_string(d);
    pcVar22 = uVar27.data;
    if ((long)uVar27.size < 1) {
      return;
    }
    pcVar24 = pcVar22 + uVar27.size;
    do {
      pcVar17 = (char *)memchr(pcVar22,0x2c,(long)pcVar24 - (long)pcVar22);
      if (pcVar17 == (char *)0x0) {
        uVar28.str_val = jsondec_mask(d,pcVar22,pcVar24);
        upb_Array_Append(arr.array,uVar28,d->arena);
        return;
      }
      uVar28.str_val = jsondec_mask(d,pcVar22,pcVar17);
      pcVar22 = pcVar17 + 1;
      upb_Array_Append(arr.array,uVar28,d->arena);
    } while (pcVar22 < pcVar24);
    return;
  case kUpb_WellKnown_Duration:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x49b,"void jsondec_duration(jsondec *, upb_Message *, const upb_MessageDef *)"
                   );
    }
    uVar27 = jsondec_string(d);
    local_38 = uVar27.data;
    pcVar24 = local_38 + uVar27.size;
    local_89 = false;
    pcVar22 = upb_BufToInt64(local_38,pcVar24,&local_70.int64_val,&local_89);
    if (pcVar22 == (char *)0x0) {
      pcVar22 = "Integer overflow";
LAB_002eeab8:
      jsondec_err(d,pcVar22);
    }
    local_38 = pcVar22;
    uVar8 = jsondec_nanos(d,&local_38,pcVar24);
    if (((long)pcVar24 - (long)local_38 != 1) || (*local_38 != 's')) {
      pcVar22 = "Malformed duration";
      goto LAB_002eeab8;
    }
    if ((char *)(local_70.int64_val - 0x4979cb9e01U) < (char *)0xffffff6d0c68c3ff) {
      pcVar22 = "Duration out of range";
      goto LAB_002eeab8;
    }
    uVar11 = -uVar8;
    if (local_89 == false) {
      uVar11 = uVar8;
    }
    puVar14 = upb_MessageDef_FindFieldByNumber(m,1);
    val.str_val.size = local_70.str_val.size;
    val.int64_val = local_70.int64_val;
    upb_Message_SetFieldByDef(msg,puVar14,val,d->arena);
    puVar14 = upb_MessageDef_FindFieldByNumber(m,2);
    puVar23 = d->arena;
LAB_002eea1e:
    uVar20 = (char *)(ulong)uVar11;
    break;
  case kUpb_WellKnown_Timestamp:
    local_88 = d;
    if (((ulong)msg->field_0 & 1) != 0) {
      local_78 = msg;
      local_50 = m;
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x459,
                    "void jsondec_timestamp(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    local_78 = msg;
    local_50 = m;
    uVar27 = jsondec_string(d);
    pjVar26 = local_88;
    local_70.int64_val = (int64_t)uVar27.data;
    if (0x13 < uVar27.size) {
      end = (upb_Map *)(&(local_70.map_val)->key_size + uVar27.size);
      iVar7 = jsondec_tsdigits(local_88,(char **)&local_70.array_val,4,"-");
      uVar8 = jsondec_tsdigits(pjVar26,(char **)&local_70.array_val,2,"-");
      iVar13 = uVar8 + 9;
      if (2 < uVar8) {
        iVar13 = uVar8 - 3;
      }
      iVar9 = jsondec_tsdigits(pjVar26,(char **)&local_70.array_val,2,"T");
      iVar10 = jsondec_tsdigits(pjVar26,(char **)&local_70.array_val,2,":");
      local_40 = (upb_FieldDef *)CONCAT44(local_40._4_4_,iVar10);
      iVar10 = jsondec_tsdigits(pjVar26,(char **)&local_70.array_val,2,":");
      local_48 = (jsondec *)CONCAT44(local_48._4_4_,iVar10);
      iVar10 = jsondec_tsdigits(pjVar26,(char **)&local_70.array_val,2,(char *)0x0);
      local_58 = (upb_FieldDef *)CONCAT44(local_58._4_4_,iVar10);
      uVar11 = jsondec_nanos(pjVar26,(char **)&local_70.array_val,(char *)end);
      pjVar26 = local_88;
      if (local_70._0_8_ != end) {
        uVar8 = (iVar7 - (uint)(uVar8 < 3)) + 0x12c0;
        lVar25 = (long)(int)local_58 + (long)((int)local_48 * 0x3c) + (long)((int)local_40 * 0xe10)
                 + (long)(int)((iVar13 * 0xf4ff + 0x301U >> 0xb) +
                               uVar8 / 400 + (uVar8 >> 2) + (iVar9 - uVar8 / 100) + uVar8 * 0x16d +
                              -0x25bab9) * 0x15180;
        local_70.str_val.size =
             (long)&(local_70.array_val)->data_dont_copy_me__upb_internal_use_only + 1;
        cVar2 = (local_70.map_val)->key_size;
        local_70.array_val = (upb_Array *)local_70.str_val.size;
        if (cVar2 == '+') {
          bVar4 = false;
LAB_002ee960:
          if ((long)end - local_70.str_val.size == 5) {
            iVar13 = jsondec_tsdigits(local_88,(char **)&local_70.array_val,2,":");
            iVar7 = jsondec_tsdigits(pjVar26,(char **)&local_70.array_val,2,(char *)0x0);
            iVar7 = iVar13 * 0x3c + iVar7;
            uVar8 = iVar7 * -0x3c;
            if (bVar4) {
              uVar8 = iVar7 * 0x3c;
            }
            local_70.str_val.size = (size_t)uVar8;
            lVar25 = lVar25 + (int)uVar8;
LAB_002ee9c0:
            puVar16 = local_50;
            if (lVar25 < -0xe7791f700) {
              pcVar22 = "Timestamp out of range";
              goto LAB_002eebcd;
            }
            puVar14 = upb_MessageDef_FindFieldByNumber(local_50,1);
            msg = local_78;
            pjVar26 = local_88;
            uVar28.str_val.size = local_70.str_val.size;
            uVar28.int64_val = lVar25;
            upb_Message_SetFieldByDef(local_78,puVar14,uVar28,local_88->arena);
            puVar14 = upb_MessageDef_FindFieldByNumber(puVar16,2);
            puVar23 = pjVar26->arena;
            goto LAB_002eea1e;
          }
        }
        else if (cVar2 == 'Z') {
          if (local_70._8_8_ == end) goto LAB_002ee9c0;
        }
        else if (cVar2 == '-') {
          bVar4 = true;
          goto LAB_002ee960;
        }
      }
    }
    pcVar22 = "Malformed timestamp";
LAB_002eebcd:
    jsondec_err(local_88,pcVar22);
  case kUpb_WellKnown_DoubleValue:
  case kUpb_WellKnown_FloatValue:
  case kUpb_WellKnown_Int64Value:
  case kUpb_WellKnown_UInt64Value:
  case kUpb_WellKnown_Int32Value:
  case kUpb_WellKnown_UInt32Value:
  case kUpb_WellKnown_StringValue:
  case kUpb_WellKnown_BytesValue:
  case kUpb_WellKnown_BoolValue:
    if (((ulong)msg->field_0 & 1) != 0) {
      __assert_fail("!upb_Message_IsFrozen(msg)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5cd,"void jsondec_wrapper(jsondec *, upb_Message *, const upb_MessageDef *)")
      ;
    }
    puVar14 = upb_MessageDef_FindFieldByNumber(m,1);
    jsondec_value((upb_JsonMessageValue *)&local_70.str_val,d,puVar14);
    if (local_60 != '\0') {
      __assert_fail("val.ignore == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5d0,"void jsondec_wrapper(jsondec *, upb_Message *, const upb_MessageDef *)")
      ;
    }
    puVar23 = d->arena;
    uVar20 = local_70.int64_val;
    break;
  case kUpb_WellKnown_Value:
    jsondec_wellknownvalue(d,msg,m);
    return;
  case kUpb_WellKnown_ListValue:
    jsondec_listvalue(d,msg,m);
    return;
  case kUpb_WellKnown_Struct:
    jsondec_struct(d,msg,m);
    return;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                  ,0x5f9,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)")
    ;
  }
  val_00.str_val.size = local_70.str_val.size;
  val_00.double_val = (double)uVar20;
  upb_Message_SetFieldByDef(msg,puVar14,val_00,puVar23);
  return;
}

Assistant:

static void jsondec_wellknown(jsondec* d, upb_Message* msg,
                              const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  switch (upb_MessageDef_WellKnownType(m)) {
    case kUpb_WellKnown_Any:
      jsondec_any(d, msg, m);
      break;
    case kUpb_WellKnown_FieldMask:
      jsondec_fieldmask(d, msg, m);
      break;
    case kUpb_WellKnown_Duration:
      jsondec_duration(d, msg, m);
      break;
    case kUpb_WellKnown_Timestamp:
      jsondec_timestamp(d, msg, m);
      break;
    case kUpb_WellKnown_Value:
      jsondec_wellknownvalue(d, msg, m);
      break;
    case kUpb_WellKnown_ListValue:
      jsondec_listvalue(d, msg, m);
      break;
    case kUpb_WellKnown_Struct:
      jsondec_struct(d, msg, m);
      break;
    case kUpb_WellKnown_DoubleValue:
    case kUpb_WellKnown_FloatValue:
    case kUpb_WellKnown_Int64Value:
    case kUpb_WellKnown_UInt64Value:
    case kUpb_WellKnown_Int32Value:
    case kUpb_WellKnown_UInt32Value:
    case kUpb_WellKnown_StringValue:
    case kUpb_WellKnown_BytesValue:
    case kUpb_WellKnown_BoolValue:
      jsondec_wrapper(d, msg, m);
      break;
    default:
      UPB_UNREACHABLE();
  }
}